

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  secp256k1_modinv64_signed62 *psVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  secp256k1_modinv64_modinfo *psVar13;
  secp256k1_modinv64_signed62 *psVar14;
  long lVar15;
  long lVar16;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  ulong *extraout_RDX_02;
  secp256k1_modinv64_signed62 *a;
  secp256k1_fe *a_00;
  uint uVar17;
  secp256k1_modinv64_modinfo *psVar18;
  int iVar19;
  int alen;
  ulong uVar20;
  secp256k1_modinv64_signed62 *a_01;
  secp256k1_modinv64_signed62 *psVar21;
  secp256k1_modinv64_signed62 *psVar22;
  secp256k1_modinv64_signed62 *psVar23;
  secp256k1_modinv64_signed62 *psVar24;
  int64_t *piVar25;
  int64_t *piVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  secp256k1_modinv64_modinfo *psVar30;
  ulong uVar31;
  secp256k1_modinv64_signed62 *psVar32;
  ulong uVar33;
  secp256k1_modinv64_signed62 *psVar34;
  bool bVar35;
  secp256k1_modinv64_signed62 f;
  uint64_t c1;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  secp256k1_fe tmp;
  secp256k1_modinv64_signed62 sStack_340;
  secp256k1_modinv64_signed62 sStack_318;
  secp256k1_modinv64_signed62 *psStack_2f0;
  secp256k1_modinv64_signed62 *psStack_2e8;
  secp256k1_modinv64_signed62 *psStack_2e0;
  ulong uStack_2d0;
  secp256k1_modinv64_signed62 *psStack_2c8;
  ulong uStack_2c0;
  secp256k1_modinv64_signed62 *psStack_2b8;
  secp256k1_modinv64_signed62 *psStack_2b0;
  secp256k1_modinv64_signed62 *psStack_2a8;
  secp256k1_modinv64_signed62 *psStack_2a0;
  int64_t iStack_298;
  secp256k1_modinv64_signed62 *psStack_290;
  secp256k1_modinv64_signed62 *psStack_288;
  secp256k1_modinv64_signed62 *psStack_280;
  secp256k1_modinv64_signed62 *psStack_278;
  int64_t iStack_270;
  secp256k1_modinv64_signed62 *psStack_268;
  int64_t iStack_260;
  int64_t iStack_258;
  secp256k1_fe *psStack_250;
  secp256k1_modinv64_modinfo *psStack_248;
  secp256k1_modinv64_signed62 *psStack_240;
  ulong uStack_238;
  secp256k1_modinv64_signed62 *psStack_230;
  secp256k1_modinv64_modinfo *psStack_228;
  code *pcStack_220;
  ulong local_210;
  secp256k1_modinv64_signed62 *local_208;
  secp256k1_modinv64_signed62 *local_200;
  secp256k1_modinv64_signed62 *local_1f8;
  secp256k1_modinv64_signed62 *local_1f0;
  secp256k1_modinv64_signed62 *local_1e8;
  secp256k1_modinv64_signed62 *local_1e0;
  secp256k1_modinv64_modinfo *local_1d8;
  secp256k1_modinv64_signed62 *local_1d0;
  secp256k1_modinv64_signed62 local_1c8;
  long local_198;
  secp256k1_fe *local_190;
  ulong local_188;
  ulong local_180;
  secp256k1_fe *local_178;
  ulong local_170;
  ulong local_168;
  secp256k1_modinv64_modinfo *local_160;
  ulong local_158;
  secp256k1_modinv64_signed62 *local_150;
  secp256k1_modinv64_signed62 local_148;
  secp256k1_modinv64_signed62 local_118;
  secp256k1_modinv64_trans2x2 local_e8;
  secp256k1_modinv64_signed62 local_c8;
  secp256k1_modinv64_signed62 local_98;
  secp256k1_fe local_68;
  
  psVar13 = (secp256k1_modinv64_modinfo *)0x0;
  pcStack_220 = (code *)0x11792c;
  local_178 = r;
  secp256k1_fe_verify(x);
  local_198 = 0x1000003d1;
  uVar7 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar20 = (uVar7 >> 0x34) + x->n[1];
  uVar10 = (uVar20 >> 0x34) + x->n[2];
  uVar11 = (uVar10 >> 0x34) + x->n[3];
  uVar12 = (uVar11 >> 0x34) + (x->n[4] & 0xffffffffffff);
  local_180 = (uVar20 | uVar7 | uVar10 | uVar11) & 0xfffffffffffff | uVar12;
  local_188 = (uVar7 ^ 0x1000003d0) & uVar20 & uVar10 & uVar11 & (uVar12 ^ 0xf000000000000);
  pcStack_220 = (code *)0x1179af;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  pcStack_220 = (code *)0x1179e1;
  local_190 = x;
  secp256k1_fe_normalize(&local_68);
  local_148.v[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  a_01 = (secp256k1_modinv64_signed62 *)
         ((ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10);
  local_210 = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_1d0 = (secp256k1_modinv64_signed62 *)
              ((local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e);
  uVar7 = local_68.n[4] >> 0x28;
  local_c8.v[4] = 0;
  local_c8.v[2] = 0;
  local_c8.v[3] = 0;
  local_c8.v[0] = 0;
  local_c8.v[1] = 0;
  local_98.v[1] = 0;
  local_98.v[4] = 0;
  local_98.v[2] = 0;
  local_98.v[3] = 0;
  local_98.v[0] = 1;
  psVar24 = &local_1c8;
  local_1c8.v[2] = 0;
  local_1c8.v[3] = 0;
  local_1c8.v[0] = -0x1000003d1;
  local_1c8.v[1] = 0;
  local_1c8.v[4] = 0x100;
  local_1e0 = (secp256k1_modinv64_signed62 *)0;
  local_1f0 = (secp256k1_modinv64_signed62 *)0;
  local_1f8 = (secp256k1_modinv64_signed62 *)0;
  local_1d8 = (secp256k1_modinv64_modinfo *)0x100;
  a_00 = (secp256k1_fe *)0xffffffffffffffff;
  psVar23 = (secp256k1_modinv64_signed62 *)local_148.v[0];
  psVar14 = (secp256k1_modinv64_signed62 *)-0x1000003d1;
  local_208 = a_01;
  local_148.v[1] = (int64_t)a_01;
  local_148.v[2] = local_210;
  local_148.v[3] = (int64_t)local_1d0;
  local_148.v[4] = uVar7;
  local_118.v[0] = local_148.v[0];
  local_118.v[1] = (int64_t)a_01;
  local_118.v[2] = local_210;
  local_118.v[3] = (int64_t)local_1d0;
  local_118.v[4] = uVar7;
  do {
    psVar18 = (secp256k1_modinv64_modinfo *)0x8;
    lVar8 = 3;
    uVar10 = 0;
    psVar22 = (secp256k1_modinv64_signed62 *)0x0;
    psVar30 = (secp256k1_modinv64_modinfo *)0x8;
    psVar4 = psVar23;
    psVar32 = psVar14;
    do {
      local_160 = psVar13;
      if (((ulong)psVar32 & 1) == 0) {
        pcStack_220 = (code *)0x118633;
        secp256k1_fe_inv_cold_30();
        psVar21 = a_01;
LAB_00118633:
        pcStack_220 = (code *)0x118638;
        secp256k1_fe_inv_cold_1();
LAB_00118638:
        pcStack_220 = (code *)0x11863d;
        secp256k1_fe_inv_cold_2();
LAB_0011863d:
        pcStack_220 = (code *)0x118642;
        secp256k1_fe_inv_cold_29();
        psVar4 = psVar24;
        goto LAB_00118642;
      }
      psVar24 = (secp256k1_modinv64_signed62 *)
                (uVar10 * (long)psVar23 + (long)psVar18 * (long)psVar14);
      psVar21 = (secp256k1_modinv64_signed62 *)((long)psVar32 << ((byte)lVar8 & 0x3f));
      if (psVar24 != psVar21) goto LAB_00118633;
      psVar24 = (secp256k1_modinv64_signed62 *)
                ((long)psVar30 * (long)psVar23 + (long)psVar22 * (long)psVar14);
      psVar21 = (secp256k1_modinv64_signed62 *)((long)psVar4 << ((byte)lVar8 & 0x3f));
      if (psVar24 != psVar21) goto LAB_00118638;
      a_01 = (secp256k1_modinv64_signed62 *)((long)a_00 >> 0x3f);
      local_158 = (ulong)((uint)psVar4 & 1);
      uVar11 = -local_158;
      psVar24 = (secp256k1_modinv64_signed62 *)((ulong)a_01 & uVar11);
      a_00 = (secp256k1_fe *)((ulong)a_00 ^ (ulong)psVar24);
      psVar21 = a_01;
      local_150 = a_01;
      if ((undefined1 *)((long)a_00[-0xd].n + 0x1fU) < (undefined1 *)0xfffffffffffffb61)
      goto LAB_0011863d;
      a_00 = (secp256k1_fe *)((long)&a_00[-1].normalized + 3);
      psVar30 = (secp256k1_modinv64_modinfo *)
                ((long)(psVar30->modulus).v + (((ulong)a_01 ^ uVar10) - (long)a_01 & uVar11));
      uVar10 = (uVar10 + ((ulong)psVar30 & (ulong)psVar24)) * 2;
      psVar22 = (secp256k1_modinv64_signed62 *)
                ((long)psVar22->v + (((ulong)a_01 ^ (ulong)psVar18) - (long)a_01 & uVar11));
      psVar18 = (secp256k1_modinv64_modinfo *)
                (((long)(psVar18->modulus).v + ((ulong)psVar22 & (ulong)psVar24)) * 2);
      uVar11 = (long)psVar4->v + (((ulong)a_01 ^ (ulong)psVar32) - (long)a_01 & uVar11);
      psVar4 = (secp256k1_modinv64_signed62 *)(uVar11 >> 1);
      psVar32 = (secp256k1_modinv64_signed62 *)((long)psVar32->v + (uVar11 & (ulong)psVar24));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x3e);
    psVar21 = (secp256k1_modinv64_signed62 *)(uVar10 * (long)psVar22);
    psVar13 = SUB168(SEXT816((long)uVar10) * SEXT816((long)psVar22),8);
    psVar4 = psVar24;
    local_e8.u = (int64_t)psVar18;
    local_e8.v = uVar10;
    local_e8.q = (int64_t)psVar22;
    local_e8.r = (int64_t)psVar30;
    if ((SUB168(SEXT816((long)psVar18) * SEXT816((long)psVar30),8) - (long)psVar13) -
        (ulong)((secp256k1_modinv64_signed62 *)((long)psVar18 * (long)psVar30) < psVar21) != 2 ||
        (long)psVar18 * (long)psVar30 - (long)psVar21 != 0) {
LAB_00118642:
      pcStack_220 = (code *)0x118647;
      secp256k1_fe_inv_cold_3();
LAB_00118647:
      pcStack_220 = (code *)0x11864c;
      secp256k1_fe_inv_cold_28();
LAB_0011864c:
      pcStack_220 = (code *)0x118651;
      secp256k1_fe_inv_cold_27();
LAB_00118651:
      pcStack_220 = (code *)0x118656;
      secp256k1_fe_inv_cold_26();
LAB_00118656:
      pcStack_220 = (code *)0x11865b;
      secp256k1_fe_inv_cold_25();
LAB_0011865b:
      pcStack_220 = (code *)0x118660;
      secp256k1_fe_inv_cold_4();
LAB_00118660:
      pcStack_220 = (code *)0x118665;
      secp256k1_fe_inv_cold_5();
LAB_00118665:
      pcStack_220 = (code *)0x11866a;
      secp256k1_fe_inv_cold_6();
LAB_0011866a:
      pcStack_220 = (code *)0x11866f;
      secp256k1_fe_inv_cold_7();
LAB_0011866f:
      pcStack_220 = (code *)0x118674;
      secp256k1_fe_inv_cold_8();
LAB_00118674:
      pcStack_220 = (code *)0x118679;
      secp256k1_fe_inv_cold_9();
LAB_00118679:
      pcStack_220 = (code *)0x11867e;
      secp256k1_fe_inv_cold_10();
      psVar32 = psVar14;
LAB_0011867e:
      pcStack_220 = (code *)0x118683;
      secp256k1_fe_inv_cold_11();
      psVar24 = local_1e0;
LAB_00118683:
      local_1e0 = psVar24;
      pcStack_220 = (code *)0x118688;
      secp256k1_fe_inv_cold_12();
      psVar13 = psVar18;
      uVar7 = uVar10;
LAB_00118688:
      pcStack_220 = (code *)0x11868d;
      secp256k1_fe_inv_cold_13();
      psVar34 = psVar22;
LAB_0011868d:
      pcStack_220 = (code *)0x118692;
      secp256k1_fe_inv_cold_14();
LAB_00118692:
      pcStack_220 = (code *)0x118697;
      secp256k1_fe_inv_cold_15();
LAB_00118697:
      pcStack_220 = (code *)0x11869c;
      secp256k1_fe_inv_cold_24();
      a_01 = psVar21;
      psVar24 = psVar4;
LAB_0011869c:
      pcStack_220 = (code *)0x1186a1;
      secp256k1_fe_inv_cold_23();
LAB_001186a1:
      pcStack_220 = (code *)0x1186a6;
      secp256k1_fe_inv_cold_22();
LAB_001186a6:
      pcStack_220 = (code *)0x1186ab;
      secp256k1_fe_inv_cold_21();
LAB_001186ab:
      pcStack_220 = (code *)0x1186b0;
      secp256k1_fe_inv_cold_20();
LAB_001186b0:
      psVar14 = psVar32;
      pcStack_220 = (code *)0x1186b5;
      secp256k1_fe_inv_cold_19();
      goto LAB_001186b5;
    }
    pcStack_220 = (code *)0x117cc5;
    local_200 = psVar23;
    local_1e8 = psVar14;
    local_168 = uVar7;
    secp256k1_modinv64_update_de_62(&local_c8,&local_98,&local_e8,psVar13);
    psVar14 = &local_1c8;
    psVar21 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_220 = (code *)0x117ce5;
    psVar4 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar14,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar3 < 1) goto LAB_00118647;
    psVar21 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_220 = (code *)0x117d06;
    psVar4 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar14,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar3) goto LAB_0011864c;
    psVar14 = &local_118;
    psVar21 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_220 = (code *)0x117d31;
    psVar4 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar14,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar3 < 1) goto LAB_00118651;
    psVar21 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_220 = (code *)0x117d52;
    psVar4 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar14,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_00118656;
    psVar4 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)local_1e8);
    lVar8 = SUB168(SEXT816((long)psVar18) * SEXT816((long)local_1e8),8);
    uVar7 = uVar10 * (long)local_200;
    psVar21 = SUB168(SEXT816((long)uVar10) * SEXT816((long)local_200),8);
    if ((-1 < (long)psVar21) &&
       (uVar11 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar7) < psVar4),
       lVar9 = (0x7fffffffffffffff - (long)psVar21) - lVar8,
       (SBORROW8(0x7fffffffffffffff - (long)psVar21,lVar8) != SBORROW8(lVar9,uVar11)) !=
       (long)(lVar9 - uVar11) < 0)) goto LAB_0011865b;
    piVar25 = (int64_t *)((long)psVar4->v + uVar7);
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((long)psVar21->v + (ulong)CARRY8(uVar7,(ulong)psVar4) + lVar8);
    uVar7 = (long)psVar22 * (long)local_1e8;
    psVar4 = SUB168(SEXT816((long)psVar22) * SEXT816((long)local_1e8),8);
    uVar11 = (long)psVar30 * (long)local_200;
    lVar8 = SUB168(SEXT816((long)psVar30) * SEXT816((long)local_200),8);
    if ((-1 < lVar8) &&
       (uVar12 = (ulong)(-uVar11 - 1 < uVar7), lVar9 = (0x7fffffffffffffff - lVar8) - (long)psVar4,
       (SBORROW8(0x7fffffffffffffff - lVar8,(long)psVar4) != SBORROW8(lVar9,uVar12)) !=
       (long)(lVar9 - uVar12) < 0)) goto LAB_00118660;
    psVar4 = (secp256k1_modinv64_signed62 *)((long)psVar4->v + (ulong)CARRY8(uVar7,uVar11) + lVar8);
    if (((ulong)piVar25 & 0x3ffffffffffffffe) != 0) goto LAB_00118665;
    if ((uVar7 + uVar11 & 0x3fffffffffffffff) != 0) goto LAB_0011866a;
    uVar12 = (ulong)piVar25 >> 0x3e | (long)psVar21 * 4;
    local_1e8 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)local_1e0 + uVar12);
    lVar9 = SUB168(SEXT816((long)psVar18) * SEXT816((long)local_1e0),8) + ((long)psVar21 >> 0x3e) +
            (ulong)CARRY8((long)psVar18 * (long)local_1e0,uVar12);
    local_200 = (secp256k1_modinv64_signed62 *)(uVar10 * (long)local_208);
    psVar14 = SUB168(SEXT816((long)uVar10) * SEXT816((long)local_208),8);
    uVar12 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - (long)local_200) < local_1e8);
    lVar8 = (0x7fffffffffffffff - (long)psVar14) - lVar9;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - (long)psVar14) -
              (ulong)(local_200 != (secp256k1_modinv64_signed62 *)0x0));
    bVar35 = (SBORROW8(0x7fffffffffffffff - (long)psVar14,lVar9) != SBORROW8(lVar8,uVar12)) ==
             (long)(lVar8 - uVar12) < 0;
    if ((long)psVar14 < 0) {
      bVar35 = (SBORROW8(lVar9,(long)psVar21) !=
               SBORROW8(lVar9 - (long)psVar21,
                        (ulong)(local_1e8 < (secp256k1_modinv64_signed62 *)-(long)local_200))) ==
               (long)((lVar9 - (long)psVar21) -
                     (ulong)(local_1e8 < (secp256k1_modinv64_signed62 *)-(long)local_200)) < 0;
    }
    if (!bVar35) goto LAB_0011866f;
    uVar7 = uVar7 + uVar11 >> 0x3e | (long)psVar4 * 4;
    uVar12 = (long)psVar22 * (long)local_1e0 + uVar7;
    psVar21 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)psVar22) * SEXT816((long)local_1e0),8) + ((long)psVar4 >> 0x3e)
              + (ulong)CARRY8((long)psVar22 * (long)local_1e0,uVar7));
    uVar11 = (long)psVar30 * (long)local_208;
    lVar15 = SUB168(SEXT816((long)psVar30) * SEXT816((long)local_208),8);
    uVar7 = (ulong)(-uVar11 - 1 < uVar12);
    lVar8 = (0x7fffffffffffffff - lVar15) - (long)psVar21;
    lVar28 = (-0x8000000000000000 - lVar15) - (ulong)(uVar11 != 0);
    lVar16 = (long)psVar21 - lVar28;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar21) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8((long)psVar21,lVar28) != SBORROW8(lVar16,(ulong)(uVar12 < -uVar11))) ==
               (long)(lVar16 - (ulong)(uVar12 < -uVar11)) < 0;
    }
    psVar4 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    if (bVar35 == false) goto LAB_00118674;
    uVar20 = (long)local_200->v + (long)local_1e8->v;
    lVar8 = (long)psVar14->v + (ulong)CARRY8((ulong)local_1e8,(ulong)local_200) + lVar9;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((long)psVar21->v + (ulong)CARRY8(uVar12,uVar11) + lVar15);
    uVar7 = lVar8 * 4 | uVar20 >> 0x3e;
    local_1e8 = (secp256k1_modinv64_signed62 *)(uVar20 & 0x3fffffffffffffff);
    psVar14 = (secp256k1_modinv64_signed62 *)(uVar12 + uVar11 & 0x3fffffffffffffff);
    psVar24 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)local_1f0 + uVar7);
    lVar9 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)psVar18) * SEXT816((long)local_1f0),8) +
            (ulong)CARRY8((long)psVar18 * (long)local_1f0,uVar7);
    local_170 = uVar10 * local_210;
    local_208 = SUB168(SEXT816((long)uVar10) * SEXT816((long)local_210),8);
    uVar7 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - local_170) < psVar24);
    lVar8 = (0x7fffffffffffffff - (long)local_208) - lVar9;
    psVar4 = (secp256k1_modinv64_signed62 *)
             ((-0x8000000000000000 - (long)local_208) - (ulong)(local_170 != 0));
    bVar35 = (SBORROW8(0x7fffffffffffffff - (long)local_208,lVar9) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if ((long)local_208 < 0) {
      bVar35 = (SBORROW8(lVar9,(long)psVar4) !=
               SBORROW8(lVar9 - (long)psVar4,
                        (ulong)(psVar24 < (secp256k1_modinv64_signed62 *)-local_170))) ==
               (long)((lVar9 - (long)psVar4) -
                     (ulong)(psVar24 < (secp256k1_modinv64_signed62 *)-local_170)) < 0;
    }
    local_200 = psVar14;
    local_1e0 = psVar24;
    local_1c8.v[0] = (int64_t)local_1e8;
    local_118.v[0] = (int64_t)psVar14;
    if (!bVar35) goto LAB_00118679;
    uVar7 = uVar12 + uVar11 >> 0x3e | (long)psVar21 * 4;
    uVar12 = (long)psVar22 * (long)local_1f0 + uVar7;
    psVar4 = (secp256k1_modinv64_signed62 *)
             (SUB168(SEXT816((long)psVar22) * SEXT816((long)local_1f0),8) + ((long)psVar21 >> 0x3e)
             + (ulong)CARRY8((long)psVar22 * (long)local_1f0,uVar7));
    uVar11 = (long)psVar30 * local_210;
    lVar15 = SUB168(SEXT816((long)psVar30) * SEXT816((long)local_210),8);
    uVar7 = (ulong)(-uVar11 - 1 < uVar12);
    lVar8 = (0x7fffffffffffffff - lVar15) - (long)psVar4;
    lVar28 = (-0x8000000000000000 - lVar15) - (ulong)(uVar11 != 0);
    lVar16 = (long)psVar4 - lVar28;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar4) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8((long)psVar4,lVar28) != SBORROW8(lVar16,(ulong)(uVar12 < -uVar11))) ==
               (long)(lVar16 - (ulong)(uVar12 < -uVar11)) < 0;
    }
    psVar21 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    psVar32 = psVar14;
    if (bVar35 == false) goto LAB_0011867e;
    piVar25 = (int64_t *)((long)psVar24->v + local_170);
    lVar8 = (long)local_208->v + (ulong)CARRY8((ulong)psVar24,local_170) + lVar9;
    psVar4 = (secp256k1_modinv64_signed62 *)
             ((long)psVar4->v + (ulong)CARRY8(uVar12,uVar11) + lVar15);
    uVar7 = lVar8 * 4 | (ulong)piVar25 >> 0x3e;
    local_1e0 = (secp256k1_modinv64_signed62 *)((ulong)piVar25 & 0x3fffffffffffffff);
    local_208 = (secp256k1_modinv64_signed62 *)(uVar12 + uVar11 & 0x3fffffffffffffff);
    local_1f0 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)local_1f8 + uVar7);
    lVar9 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)psVar18) * SEXT816((long)local_1f8),8) +
            (ulong)CARRY8((long)psVar18 * (long)local_1f8,uVar7);
    local_210 = uVar10 * (long)local_1d0;
    lVar16 = SUB168(SEXT816((long)uVar10) * SEXT816((long)local_1d0),8);
    uVar7 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - local_210) < local_1f0);
    lVar8 = (0x7fffffffffffffff - lVar16) - lVar9;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - lVar16) - (ulong)(local_210 != 0));
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar9) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if (lVar16 < 0) {
      bVar35 = (SBORROW8(lVar9,(long)psVar21) !=
               SBORROW8(lVar9 - (long)psVar21,
                        (ulong)(local_1f0 < (secp256k1_modinv64_signed62 *)-local_210))) ==
               (long)((lVar9 - (long)psVar21) -
                     (ulong)(local_1f0 < (secp256k1_modinv64_signed62 *)-local_210)) < 0;
    }
    psVar32 = local_1e0;
    local_1c8.v[1] = (int64_t)local_1e0;
    local_118.v[1] = (int64_t)local_208;
    if (!bVar35) goto LAB_00118683;
    uVar7 = uVar12 + uVar11 >> 0x3e | (long)psVar4 * 4;
    psVar32 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar12 = (long)psVar22 * (long)local_1f8 + uVar7;
    psVar21 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)psVar22) * SEXT816((long)local_1f8),8) + ((long)psVar4 >> 0x3e)
              + (ulong)CARRY8((long)psVar22 * (long)local_1f8,uVar7));
    uVar11 = (long)psVar30 * (long)local_1d0;
    lVar28 = SUB168(SEXT816((long)psVar30) * SEXT816((long)local_1d0),8);
    uVar7 = (ulong)(-uVar11 - 1 < uVar12);
    lVar8 = (0x7fffffffffffffff - lVar28) - (long)psVar21;
    lVar29 = (-0x8000000000000000 - lVar28) - (ulong)(uVar11 != 0);
    lVar15 = (long)psVar21 - lVar29;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar28,(long)psVar21) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if (lVar28 < 0) {
      bVar35 = (SBORROW8((long)psVar21,lVar29) != SBORROW8(lVar15,(ulong)(uVar12 < -uVar11))) ==
               (long)(lVar15 - (ulong)(uVar12 < -uVar11)) < 0;
    }
    psVar4 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    psVar13 = psVar18;
    uVar7 = uVar10;
    if (bVar35 == false) goto LAB_00118688;
    piVar25 = (int64_t *)((long)local_1f0->v + local_210);
    lVar8 = lVar9 + lVar16 + (ulong)CARRY8((ulong)local_1f0,local_210);
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((long)psVar21->v + (ulong)CARRY8(uVar12,uVar11) + lVar28);
    uVar7 = lVar8 * 4 | (ulong)piVar25 >> 0x3e;
    psVar32 = (secp256k1_modinv64_signed62 *)((ulong)piVar25 & 0x3fffffffffffffff);
    local_210 = uVar12 + uVar11 & 0x3fffffffffffffff;
    local_1f8 = (secp256k1_modinv64_signed62 *)((long)psVar18 * (long)local_1d8 + uVar7);
    lVar9 = (lVar8 >> 0x3e) + SUB168(SEXT816((long)psVar18) * SEXT816((long)local_1d8),8) +
            (ulong)CARRY8((long)psVar18 * (long)local_1d8,uVar7);
    uVar20 = uVar10 * local_168;
    psVar4 = SUB168(SEXT816((long)uVar10) * SEXT816((long)local_168),8);
    uVar7 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar20) < local_1f8);
    lVar8 = (0x7fffffffffffffff - (long)psVar4) - lVar9;
    bVar35 = (SBORROW8(0x7fffffffffffffff - (long)psVar4,lVar9) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    uVar7 = CONCAT71((int7)(uVar10 >> 8),bVar35);
    lVar16 = (-0x8000000000000000 - (long)psVar4) - (ulong)(uVar20 != 0);
    lVar8 = lVar9 - lVar16;
    if ((long)psVar4 < 0) {
      bVar35 = (SBORROW8(lVar9,lVar16) !=
               SBORROW8(lVar8,(ulong)(local_1f8 < (secp256k1_modinv64_signed62 *)-uVar20))) ==
               (long)(lVar8 - (ulong)(local_1f8 < (secp256k1_modinv64_signed62 *)-uVar20)) < 0;
    }
    psVar13 = local_1d8;
    psVar34 = psVar22;
    local_1c8.v[2] = (int64_t)psVar32;
    local_118.v[2] = local_210;
    if (!bVar35) goto LAB_0011868d;
    uVar10 = uVar12 + uVar11 >> 0x3e | (long)psVar21 * 4;
    psVar34 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
    uVar7 = (long)psVar22 * (long)local_1d8 + uVar10;
    lVar28 = SUB168(SEXT816((long)psVar22) * SEXT816((long)local_1d8),8) + ((long)psVar21 >> 0x3e) +
             (ulong)CARRY8((long)psVar22 * (long)local_1d8,uVar10);
    uVar11 = (long)psVar30 * local_168;
    lVar15 = SUB168(SEXT816((long)psVar30) * SEXT816((long)local_168),8);
    uVar10 = (ulong)(-uVar11 - 1 < uVar7);
    lVar8 = (0x7fffffffffffffff - lVar15) - lVar28;
    lVar29 = (-0x8000000000000000 - lVar15) - (ulong)(uVar11 != 0);
    lVar16 = lVar28 - lVar29;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar28) != SBORROW8(lVar8,uVar10)) ==
             (long)(lVar8 - uVar10) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8(lVar28,lVar29) != SBORROW8(lVar16,(ulong)(uVar7 < -uVar11))) ==
               (long)(lVar16 - (ulong)(uVar7 < -uVar11)) < 0;
    }
    psVar21 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    if (bVar35 == false) goto LAB_00118692;
    piVar25 = (int64_t *)((long)local_1f8->v + uVar20);
    lVar8 = (long)psVar4->v + (ulong)CARRY8((ulong)local_1f8,uVar20) + lVar9;
    bVar35 = CARRY8(uVar7,uVar11);
    uVar7 = uVar7 + uVar11;
    lVar9 = lVar28 + lVar15 + (ulong)bVar35;
    psVar30 = (secp256k1_modinv64_modinfo *)(lVar8 * 4 | (ulong)piVar25 >> 0x3e);
    psVar21 = (secp256k1_modinv64_signed62 *)((ulong)piVar25 & 0x3fffffffffffffff);
    psVar4 = (secp256k1_modinv64_signed62 *)(uVar7 & 0x3fffffffffffffff);
    local_1c8.v[3] = (int64_t)psVar21;
    local_118.v[3] = (int64_t)psVar4;
    if ((lVar8 >> 0x3e) + -1 + (ulong)((secp256k1_modinv64_modinfo *)0x7fffffffffffffff < psVar30)
        != -1) goto LAB_00118697;
    uVar7 = uVar7 >> 0x3e | lVar9 * 4;
    a_01 = psVar21;
    psVar24 = psVar4;
    local_1c8.v[4] = (int64_t)psVar30;
    if ((lVar9 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar7) != -1) goto LAB_0011869c;
    psVar34 = &local_1c8;
    a_01 = (secp256k1_modinv64_signed62 *)0x5;
    psVar13 = &secp256k1_const_modinfo_fe;
    pcStack_220 = (code *)0x118398;
    psVar24 = psVar34;
    local_1f8 = psVar21;
    local_1d0 = psVar4;
    local_118.v[4] = uVar7;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar34,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar3 < 1) goto LAB_001186a1;
    a_01 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_220 = (code *)0x1183b5;
    psVar24 = psVar34;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar34,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar3) goto LAB_001186a6;
    psVar34 = &local_118;
    a_01 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_220 = (code *)0x1183dc;
    psVar24 = psVar34;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar34,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar3 < 1) goto LAB_001186ab;
    a_01 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_220 = (code *)0x1183fe;
    psVar24 = psVar34;
    local_1d8 = psVar30;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar34,5,&secp256k1_const_modinfo_fe.modulus,1);
    psVar14 = local_1e8;
    psVar13 = local_160;
    if (-1 < iVar3) goto LAB_001186b0;
    uVar17 = (int)local_160 + 1;
    psVar13 = (secp256k1_modinv64_modinfo *)(ulong)uVar17;
    psVar23 = local_200;
    local_1f0 = psVar32;
  } while (uVar17 != 10);
  psVar24 = &local_118;
  a_01 = (secp256k1_modinv64_signed62 *)0x5;
  pcStack_220 = (code *)0x118446;
  iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar3 == 0) {
    pcStack_220 = (code *)0x11846b;
    iVar3 = secp256k1_modinv64_mul_cmp_62(&local_1c8,5,&SECP256K1_SIGNED62_ONE,-1);
    psVar18 = extraout_RDX;
    if (iVar3 == 0) {
LAB_001184fb:
      pcStack_220 = (code *)0x118510;
      secp256k1_modinv64_normalize_62(&local_c8,(int64_t)local_1d8,psVar18);
      a_00 = local_178;
      local_148.v[4] = local_c8.v[4];
      local_148.v[2] = local_c8.v[2];
      local_148.v[3] = local_c8.v[3];
      local_148.v[0] = local_c8.v[0];
      local_148.v[1] = local_c8.v[1];
      pcStack_220 = (code *)0x11853e;
      secp256k1_fe_from_signed62(local_178,&local_148);
      a_00->magnitude = (uint)(0 < local_190->magnitude);
      a_00->normalized = 1;
      pcStack_220 = (code *)0x118561;
      secp256k1_fe_verify(a_00);
      uVar11 = (a_00->n[4] >> 0x30) * local_198 + a_00->n[0];
      uVar10 = (uVar11 >> 0x34) + a_00->n[1];
      uVar12 = (uVar10 >> 0x34) + a_00->n[2];
      uVar20 = (uVar12 >> 0x34) + a_00->n[3];
      a_01 = (secp256k1_modinv64_signed62 *)((uVar20 >> 0x34) + (a_00->n[4] & 0xffffffffffff));
      psVar24 = (secp256k1_modinv64_signed62 *)
                ((uVar11 ^ 0x1000003d0) & uVar10 & uVar12 & uVar20 & ((ulong)a_01 ^ 0xf000000000000)
                );
      if ((local_188 != 0xfffffffffffff && local_180 != 0) !=
          (psVar24 == (secp256k1_modinv64_signed62 *)0xfffffffffffff ||
          ((uVar10 | uVar11 | uVar12 | uVar20) & 0xfffffffffffff) == 0 &&
          a_01 == (secp256k1_modinv64_signed62 *)0x0)) {
        secp256k1_fe_verify(a_00);
        return;
      }
      goto LAB_001186ba;
    }
    pcStack_220 = (code *)0x11848e;
    iVar3 = secp256k1_modinv64_mul_cmp_62(&local_1c8,5,&SECP256K1_SIGNED62_ONE,1);
    psVar18 = extraout_RDX_00;
    if (iVar3 == 0) goto LAB_001184fb;
    psVar24 = &local_148;
    a_01 = (secp256k1_modinv64_signed62 *)0x5;
    pcStack_220 = (code *)0x1184ad;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar3 == 0) {
      psVar24 = &local_c8;
      a_01 = (secp256k1_modinv64_signed62 *)0x5;
      pcStack_220 = (code *)0x1184d0;
      iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar3 == 0) {
        psVar24 = &local_1c8;
        a_01 = (secp256k1_modinv64_signed62 *)0x5;
        pcStack_220 = (code *)0x1184f3;
        iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,1);
        psVar18 = extraout_RDX_01;
        if (iVar3 == 0) goto LAB_001184fb;
      }
    }
  }
  else {
LAB_001186b5:
    pcStack_220 = (code *)0x1186ba;
    secp256k1_fe_inv_cold_16();
LAB_001186ba:
    pcStack_220 = (code *)0x1186bf;
    secp256k1_fe_inv_cold_18();
  }
  pcStack_220 = secp256k1_fe_from_signed62;
  secp256k1_fe_inv_cold_17();
  uVar10 = a_01->v[0];
  if (uVar10 >> 0x3e == 0) {
    uVar11 = a_01->v[1];
    if (0x3fffffffffffffff < uVar11) goto LAB_00118793;
    uVar12 = a_01->v[2];
    if (0x3fffffffffffffff < uVar12) goto LAB_00118798;
    uVar20 = a_01->v[3];
    if (0x3fffffffffffffff < uVar20) goto LAB_0011879d;
    uVar6 = a_01->v[4];
    if (uVar6 < 0x100) {
      psVar24->v[0] = uVar10 & 0xfffffffffffff;
      psVar24->v[1] = (uVar11 & 0x3ffffffffff) << 10 | uVar10 >> 0x34;
      psVar24->v[2] = (uVar12 & 0xffffffff) << 0x14 | uVar11 >> 0x2a;
      psVar24->v[3] = (ulong)((uint)uVar20 & 0x3fffff) << 0x1e | uVar12 >> 0x20;
      psVar24->v[4] = uVar6 << 0x28 | uVar20 >> 0x16;
      return;
    }
  }
  else {
    psStack_228 = (secp256k1_modinv64_modinfo *)0x118793;
    secp256k1_fe_from_signed62_cold_5();
LAB_00118793:
    psStack_228 = (secp256k1_modinv64_modinfo *)0x118798;
    secp256k1_fe_from_signed62_cold_4();
LAB_00118798:
    psStack_228 = (secp256k1_modinv64_modinfo *)0x11879d;
    secp256k1_fe_from_signed62_cold_3();
LAB_0011879d:
    psStack_228 = (secp256k1_modinv64_modinfo *)0x1187a2;
    secp256k1_fe_from_signed62_cold_2();
  }
  psStack_228 = (secp256k1_modinv64_modinfo *)secp256k1_modinv64_update_de_62;
  secp256k1_fe_from_signed62_cold_1();
  psStack_228 = psVar13;
  psStack_230 = psVar34;
  uStack_238 = uVar7;
  psStack_240 = psVar14;
  psStack_248 = psVar30;
  psStack_250 = a_00;
  lVar8 = psVar24->v[0];
  iStack_258 = psVar24->v[1];
  psStack_268 = (secp256k1_modinv64_signed62 *)psVar24->v[2];
  iStack_270 = psVar24->v[3];
  psVar14 = (secp256k1_modinv64_signed62 *)psVar24->v[4];
  psStack_2b0 = (secp256k1_modinv64_signed62 *)a_01->v[0];
  psVar23 = (secp256k1_modinv64_signed62 *)a_01->v[1];
  iStack_260 = a_01->v[2];
  psVar4 = (secp256k1_modinv64_signed62 *)a_01->v[3];
  uStack_2c0 = *extraout_RDX_02;
  psStack_2b8 = (secp256k1_modinv64_signed62 *)extraout_RDX_02[1];
  uStack_2d0 = extraout_RDX_02[2];
  psStack_2c8 = (secp256k1_modinv64_signed62 *)extraout_RDX_02[3];
  iStack_298 = a_01->v[4];
  psVar22 = (secp256k1_modinv64_signed62 *)0x5;
  psVar32 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_2e0 = (secp256k1_modinv64_signed62 *)0x118840;
  psVar21 = psVar24;
  iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar3 < 1) {
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x119175;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00119175:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x11917a;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0011917a:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x11917f;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0011917f:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x119184;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00119184:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x119189;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00119189:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x11918e;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_0011918e:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x119193;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00119193:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x119198;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar34 = psVar23;
LAB_00119198:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x11919d;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0011919d:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191a2;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_001191a2:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191a7;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_001191a7:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191ac;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_001191ac:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191b1;
    secp256k1_modinv64_update_de_62_cold_7();
    psVar23 = psVar22;
LAB_001191b1:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191b6;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_001191b6:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191bb;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_001191bb:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191c0;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_001191c0:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191c5;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_001191c5:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191ca;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_001191ca:
    iVar3 = (int)psVar23;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191cf;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_001191cf:
    iVar19 = iVar3;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191d4;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_001191d4:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191d9;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_001191d9:
    alen = iVar19;
    psVar24 = psVar34;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191de;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_001191de:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191e3;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_001191e3:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191e8;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_001191e8:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191ed;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_001191ed:
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191f2;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_001191f2:
    a_01 = psVar21;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1191f7;
    secp256k1_modinv64_update_de_62_cold_18();
  }
  else {
    psVar32 = (secp256k1_modinv64_signed62 *)0x1;
    psVar22 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x118861;
    psVar21 = psVar24;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_00119175;
    psVar22 = (secp256k1_modinv64_signed62 *)0x5;
    psVar32 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x118884;
    psVar21 = a_01;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_0011917a;
    psVar32 = (secp256k1_modinv64_signed62 *)0x1;
    psVar22 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1188a5;
    psVar21 = a_01;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_0011917f;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1188cb;
    psStack_2a0 = psVar14;
    psStack_280 = psVar4;
    psVar4 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(uStack_2c0);
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1188d8;
    psVar21 = psStack_2b8;
    iVar5 = secp256k1_modinv64_abs((int64_t)psStack_2b8);
    psVar32 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar5);
    psVar14 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    if ((long)psVar32 < (long)psVar4) goto LAB_00119184;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1188f4;
    psVar4 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(uStack_2d0);
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x118901;
    psVar21 = psStack_2c8;
    iVar5 = secp256k1_modinv64_abs((int64_t)psStack_2c8);
    psVar32 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar5);
    if ((long)psVar32 < (long)psVar4) goto LAB_00119189;
    psVar14 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    psVar22 = (secp256k1_modinv64_signed62 *)(uStack_2c0 * lVar8);
    psVar32 = SUB168(SEXT816((long)uStack_2c0) * SEXT816(lVar8),8);
    uVar7 = (long)psStack_2b8 * (long)psStack_2b0;
    lVar16 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)psStack_2b0),8);
    lVar9 = (0x7fffffffffffffff - lVar16) - (long)psVar32;
    psVar21 = psStack_2b0;
    psStack_278 = psVar23;
    if (-1 < lVar16 &&
        (SBORROW8(0x7fffffffffffffff - lVar16,(long)psVar32) !=
        SBORROW8(lVar9,(ulong)((secp256k1_modinv64_signed62 *)~uVar7 < psVar22))) !=
        (long)(lVar9 - (ulong)((secp256k1_modinv64_signed62 *)~uVar7 < psVar22)) < 0)
    goto LAB_0011918e;
    piVar25 = (int64_t *)((long)psVar22->v + uVar7);
    lVar28 = (long)psVar32->v + (ulong)CARRY8(uVar7,(ulong)psVar22) + lVar16;
    psVar4 = (secp256k1_modinv64_signed62 *)(uStack_2d0 * lVar8);
    lVar16 = SUB168(SEXT816((long)uStack_2d0) * SEXT816(lVar8),8);
    uVar10 = (long)psStack_2c8 * (long)psStack_2b0;
    lVar15 = SUB168(SEXT816((long)psStack_2c8) * SEXT816((long)psStack_2b0),8);
    uVar7 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar10 - 1) < psVar4);
    lVar8 = (0x7fffffffffffffff - lVar15) - lVar16;
    lVar9 = lVar8 - uVar7;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar16) != SBORROW8(lVar8,uVar7)) == lVar9 < 0;
    psVar32 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)((ulong)lVar9 >> 8),lVar15 < 0 || bVar35);
    if (lVar15 >= 0 && !bVar35) goto LAB_00119193;
    psVar32 = (secp256k1_modinv64_signed62 *)(iStack_298 >> 0x3f);
    lVar8 = ((ulong)psStack_2b8 & (ulong)psVar32) + (uStack_2c0 & (long)psStack_2a0 >> 0x3f);
    piVar26 = (int64_t *)((long)psVar4->v + uVar10);
    psVar21 = (secp256k1_modinv64_signed62 *)(lVar15 + lVar16 + (ulong)CARRY8(uVar10,(ulong)psVar4))
    ;
    psStack_288 = (secp256k1_modinv64_signed62 *)
                  (lVar8 - ((long)piVar25 * 0x27c7f6e22ddacacf + lVar8 & 0x3fffffffffffffffU));
    psVar4 = (secp256k1_modinv64_signed62 *)((long)psStack_288 * -0x1000003d1);
    lVar9 = SUB168(SEXT816((long)psStack_288) * SEXT816(-0x1000003d1),8);
    uVar7 = (ulong)((undefined1 *)((long)psStack_288 * 0x1000003d1 - 1U) < piVar25);
    lVar8 = (0x7fffffffffffffff - lVar9) - lVar28;
    psVar34 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - lVar9) - (ulong)(psVar4 != (secp256k1_modinv64_signed62 *)0x0)
              );
    uVar10 = (ulong)(piVar25 < (undefined1 *)((long)psStack_288 * 0x1000003d1));
    bVar35 = (SBORROW8(lVar28,(long)psVar34) != SBORROW8(lVar28 - (long)psVar34,uVar10)) ==
             (long)((lVar28 - (long)psVar34) - uVar10) < 0;
    if ((long)psStack_288 < 1) {
      bVar35 = (SBORROW8(0x7fffffffffffffff - lVar9,lVar28) != SBORROW8(lVar8,uVar7)) ==
               (long)(lVar8 - uVar7) < 0;
    }
    psVar22 = psStack_288;
    psStack_2b0 = psVar24;
    psStack_2a8 = a_01;
    if (!bVar35) goto LAB_00119198;
    lVar8 = ((ulong)psVar32 & (ulong)psStack_2c8) + ((long)psStack_2a0 >> 0x3f & uStack_2d0);
    psVar32 = (secp256k1_modinv64_signed62 *)
              (lVar8 - ((long)piVar26 * 0x27c7f6e22ddacacf + lVar8 & 0x3fffffffffffffffU));
    bVar35 = CARRY8((ulong)psVar4,(ulong)piVar25);
    psVar4 = (secp256k1_modinv64_signed62 *)((long)piVar25 + (long)psVar4->v);
    lVar28 = lVar9 + lVar28 + (ulong)bVar35;
    psVar22 = (secp256k1_modinv64_signed62 *)((long)psVar32 >> 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = psVar32;
    uVar10 = SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),0);
    psVar34 = (secp256k1_modinv64_signed62 *)-(long)psVar32;
    lVar16 = (long)psVar34 +
             (long)psVar22 * -0x1000003d1 + SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),8);
    uVar7 = (ulong)((undefined1 *)(-uVar10 - 1) < piVar26);
    lVar8 = (0x7fffffffffffffff - lVar16) - (long)psVar21;
    lVar15 = (-0x8000000000000000 - lVar16) - (ulong)(uVar10 != 0);
    lVar9 = (long)psVar21 - lVar15;
    bVar35 = (SBORROW8((long)psVar21,lVar15) !=
             SBORROW8(lVar9,(ulong)(piVar26 < (undefined1 *)-uVar10))) ==
             (long)(lVar9 - (ulong)(piVar26 < (undefined1 *)-uVar10)) < 0;
    if ((long)psVar32 < 1) {
      bVar35 = (SBORROW8(0x7fffffffffffffff - lVar16,(long)psVar21) != SBORROW8(lVar8,uVar7)) ==
               (long)(lVar8 - uVar7) < 0;
    }
    psStack_290 = psVar22;
    if (!bVar35) goto LAB_0011919d;
    lVar8 = (long)psVar21 + (ulong)CARRY8(uVar10,(ulong)piVar26) + lVar16;
    if (((ulong)psVar4 & 0x3fffffffffffffff) != 0) goto LAB_001191a2;
    if (((long)piVar26 + uVar10 & 0x3fffffffffffffff) != 0) goto LAB_001191a7;
    uVar7 = (ulong)psVar4 >> 0x3e | lVar28 * 4;
    uVar11 = uStack_2c0 * iStack_258 + uVar7;
    psVar21 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)uStack_2c0) * SEXT816(iStack_258),8) + (lVar28 >> 0x3e) +
              (ulong)CARRY8(uStack_2c0 * iStack_258,uVar7));
    psVar4 = (secp256k1_modinv64_signed62 *)((long)psStack_2b8 * (long)psVar23);
    lVar15 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)psVar23),8);
    uVar7 = (ulong)(-(long)psVar4 - 1U < uVar11);
    lVar9 = (0x7fffffffffffffff - lVar15) - (long)psVar21;
    lVar28 = (-0x8000000000000000 - lVar15) - (ulong)(psVar4 != (secp256k1_modinv64_signed62 *)0x0);
    lVar16 = (long)psVar21 - lVar28;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar21) != SBORROW8(lVar9,uVar7)) ==
             (long)(lVar9 - uVar7) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8((long)psVar21,lVar28) !=
               SBORROW8(lVar16,(ulong)(uVar11 < (ulong)-(long)psVar4))) ==
               (long)(lVar16 - (ulong)(uVar11 < (ulong)-(long)psVar4)) < 0;
    }
    psVar34 = psVar23;
    if (!bVar35) goto LAB_001191ac;
    uVar7 = (long)piVar26 + uVar10 >> 0x3e | lVar8 * 4;
    uVar12 = uStack_2d0 * iStack_258 + uVar7;
    lVar28 = SUB168(SEXT816((long)uStack_2d0) * SEXT816(iStack_258),8) + (lVar8 >> 0x3e) +
             (ulong)CARRY8(uStack_2d0 * iStack_258,uVar7);
    uVar10 = (long)psStack_2c8 * (long)psVar23;
    lVar16 = SUB168(SEXT816((long)psStack_2c8) * SEXT816((long)psVar23),8);
    uVar7 = (ulong)(-uVar10 - 1 < uVar12);
    lVar8 = (0x7fffffffffffffff - lVar16) - lVar28;
    lVar29 = (-0x8000000000000000 - lVar16) - (ulong)(uVar10 != 0);
    lVar9 = lVar28 - lVar29;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar28) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if (lVar16 < 0) {
      bVar35 = (SBORROW8(lVar28,lVar29) != SBORROW8(lVar9,(ulong)(uVar12 < -uVar10))) ==
               (long)(lVar9 - (ulong)(uVar12 < -uVar10)) < 0;
    }
    psVar34 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    psVar23 = psVar22;
    if (bVar35 == false) goto LAB_001191b1;
    psVar23 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar6 = (long)psVar4->v + uVar11;
    lVar8 = (long)psVar21->v + (ulong)CARRY8(uVar11,(ulong)psVar4) + lVar15;
    lVar16 = lVar28 + lVar16 + (ulong)CARRY8(uVar12,uVar10);
    uVar7 = lVar8 * 4 | uVar6 >> 0x3e;
    psVar4 = (secp256k1_modinv64_signed62 *)(uVar12 + uVar10 & 0x3fffffffffffffff);
    uVar20 = uStack_2c0 * (long)psStack_268 + uVar7;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((lVar8 >> 0x3e) + SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)psStack_268),8) +
              (ulong)CARRY8(uStack_2c0 * (long)psStack_268,uVar7));
    uVar11 = (long)psStack_2b8 * iStack_260;
    lVar9 = SUB168(SEXT816((long)psStack_2b8) * SEXT816(iStack_260),8);
    uVar7 = (ulong)(-uVar11 - 1 < uVar20);
    lVar8 = (0x7fffffffffffffff - lVar9) - (long)psVar21;
    psVar34 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar9) - (ulong)(uVar11 != 0));
    psVar24->v[0] = uVar6 & 0x3fffffffffffffff;
    a_01->v[0] = (int64_t)psVar4;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar9,(long)psVar21) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if (lVar9 < 0) {
      bVar35 = (SBORROW8((long)psVar21,(long)psVar34) !=
               SBORROW8((long)psVar21 - (long)psVar34,(ulong)(uVar20 < -uVar11))) ==
               (long)(((long)psVar21 - (long)psVar34) - (ulong)(uVar20 < -uVar11)) < 0;
    }
    psVar14 = psStack_268;
    if (!bVar35) goto LAB_001191b6;
    uVar7 = uVar12 + uVar10 >> 0x3e | lVar16 * 4;
    uVar12 = uStack_2d0 * (long)psStack_268 + uVar7;
    psVar4 = (secp256k1_modinv64_signed62 *)
             (SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)psStack_268),8) + (lVar16 >> 0x3e) +
             (ulong)CARRY8(uStack_2d0 * (long)psStack_268,uVar7));
    uVar10 = (long)psStack_2c8 * iStack_260;
    lVar15 = SUB168(SEXT816((long)psStack_2c8) * SEXT816(iStack_260),8);
    uVar7 = (ulong)(-uVar10 - 1 < uVar12);
    lVar8 = (0x7fffffffffffffff - lVar15) - (long)psVar4;
    lVar28 = (-0x8000000000000000 - lVar15) - (ulong)(uVar10 != 0);
    lVar16 = (long)psVar4 - lVar28;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar4) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if (lVar15 < 0) {
      bVar35 = (SBORROW8((long)psVar4,lVar28) != SBORROW8(lVar16,(ulong)(uVar12 < -uVar10))) ==
               (long)(lVar16 - (ulong)(uVar12 < -uVar10)) < 0;
    }
    if (!bVar35) goto LAB_001191bb;
    lVar8 = (long)psVar21->v + (ulong)CARRY8(uVar20,uVar11) + lVar9;
    psVar4 = (secp256k1_modinv64_signed62 *)
             ((long)psVar4->v + (ulong)CARRY8(uVar12,uVar10) + lVar15);
    uVar7 = lVar8 * 4 | uVar20 + uVar11 >> 0x3e;
    uVar27 = uStack_2c0 * iStack_270 + uVar7;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((lVar8 >> 0x3e) + SUB168(SEXT816((long)uStack_2c0) * SEXT816(iStack_270),8) +
              (ulong)CARRY8(uStack_2c0 * iStack_270,uVar7));
    uVar6 = (long)psStack_2b8 * (long)psStack_280;
    lVar9 = SUB168(SEXT816((long)psStack_2b8) * SEXT816((long)psStack_280),8);
    uVar7 = (ulong)(-uVar6 - 1 < uVar27);
    lVar8 = (0x7fffffffffffffff - lVar9) - (long)psVar21;
    psVar23 = (secp256k1_modinv64_signed62 *)0x0;
    psVar34 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar9) - (ulong)(uVar6 != 0));
    psVar24->v[1] = uVar20 + uVar11 & 0x3fffffffffffffff;
    a_01->v[1] = uVar12 + uVar10 & 0x3fffffffffffffff;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar9,(long)psVar21) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    if (lVar9 < 0) {
      bVar35 = (SBORROW8((long)psVar21,(long)psVar34) !=
               SBORROW8((long)psVar21 - (long)psVar34,(ulong)(uVar27 < -uVar6))) ==
               (long)(((long)psVar21 - (long)psVar34) - (ulong)(uVar27 < -uVar6)) < 0;
    }
    psVar14 = psStack_280;
    if (!bVar35) goto LAB_001191c0;
    uVar7 = uVar12 + uVar10 >> 0x3e | (long)psVar4 * 4;
    uVar11 = uStack_2d0 * iStack_270 + uVar7;
    lVar15 = SUB168(SEXT816((long)uStack_2d0) * SEXT816(iStack_270),8) + ((long)psVar4 >> 0x3e) +
             (ulong)CARRY8(uStack_2d0 * iStack_270,uVar7);
    uVar10 = (long)psStack_2c8 * (long)psStack_280;
    lVar16 = SUB168(SEXT816((long)psStack_2c8) * SEXT816((long)psStack_280),8);
    psVar14 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar7 = (ulong)(-uVar10 - 1 < uVar11);
    lVar8 = (0x7fffffffffffffff - lVar16) - lVar15;
    psVar4 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar16) - (ulong)(uVar10 != 0));
    bVar35 = (SBORROW8(lVar15,(long)psVar4) !=
             SBORROW8(lVar15 - (long)psVar4,(ulong)(uVar11 < -uVar10))) ==
             (long)((lVar15 - (long)psVar4) - (ulong)(uVar11 < -uVar10)) < 0;
    psVar34 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    bVar2 = (SBORROW8(0x7fffffffffffffff - lVar16,lVar15) != SBORROW8(lVar8,uVar7)) ==
            (long)(lVar8 - uVar7) < 0;
    if (lVar16 < 0) {
      bVar2 = bVar35;
    }
    if (!bVar2) goto LAB_001191c5;
    lVar8 = (long)psVar21->v + (ulong)CARRY8(uVar27,uVar6) + lVar9;
    lVar16 = lVar15 + lVar16 + (ulong)CARRY8(uVar11,uVar10);
    uVar7 = lVar8 * 4 | uVar27 + uVar6 >> 0x3e;
    uVar20 = uStack_2c0 * (long)psStack_2a0 + uVar7;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((lVar8 >> 0x3e) + SUB168(SEXT816((long)uStack_2c0) * SEXT816((long)psStack_2a0),8) +
              (ulong)CARRY8(uStack_2c0 * (long)psStack_2a0,uVar7));
    uVar12 = (long)psStack_2b8 * iStack_298;
    lVar9 = SUB168(SEXT816((long)psStack_2b8) * SEXT816(iStack_298),8);
    uVar7 = (ulong)(-uVar12 - 1 < uVar20);
    lVar8 = (0x7fffffffffffffff - lVar9) - (long)psVar21;
    bVar35 = (SBORROW8(0x7fffffffffffffff - lVar9,(long)psVar21) != SBORROW8(lVar8,uVar7)) ==
             (long)(lVar8 - uVar7) < 0;
    psVar34 = (secp256k1_modinv64_signed62 *)CONCAT71((int7)(-uVar12 - 1 >> 8),bVar35);
    lVar15 = (-0x8000000000000000 - lVar9) - (ulong)(uVar12 != 0);
    lVar8 = (long)psVar21 - lVar15;
    psVar24->v[2] = uVar27 + uVar6 & 0x3fffffffffffffff;
    a_01->v[2] = uVar11 + uVar10 & 0x3fffffffffffffff;
    if (lVar9 < 0) {
      bVar35 = (SBORROW8((long)psVar21,lVar15) != SBORROW8(lVar8,(ulong)(uVar20 < -uVar12))) ==
               (long)(lVar8 - (ulong)(uVar20 < -uVar12)) < 0;
    }
    psVar23 = psStack_2a0;
    psVar4 = psVar24;
    if (!bVar35) goto LAB_001191ca;
    uVar7 = uVar11 + uVar10 >> 0x3e | lVar16 * 4;
    uVar11 = uVar20 + uVar12;
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((long)psVar21->v + (ulong)CARRY8(uVar20,uVar12) + lVar9);
    uVar12 = uStack_2d0 * (long)psStack_2a0 + uVar7;
    lVar16 = SUB168(SEXT816((long)uStack_2d0) * SEXT816((long)psStack_2a0),8) + (lVar16 >> 0x3e) +
             (ulong)CARRY8(uStack_2d0 * (long)psStack_2a0,uVar7);
    uVar10 = (long)psStack_2c8 * iStack_298;
    lVar9 = SUB168(SEXT816((long)psStack_2c8) * SEXT816(iStack_298),8);
    uVar7 = (ulong)(-uVar10 - 1 < uVar12);
    lVar8 = (0x7fffffffffffffff - lVar9) - lVar16;
    iVar19 = 0;
    alen = 0;
    psVar4 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar9) - (ulong)(uVar10 != 0));
    bVar35 = (SBORROW8(lVar16,(long)psVar4) !=
             SBORROW8(lVar16 - (long)psVar4,(ulong)(uVar12 < -uVar10))) ==
             (long)((lVar16 - (long)psVar4) - (ulong)(uVar12 < -uVar10)) < 0;
    psVar34 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    bVar2 = (SBORROW8(0x7fffffffffffffff - lVar9,lVar16) != SBORROW8(lVar8,uVar7)) ==
            (long)(lVar8 - uVar7) < 0;
    if (lVar9 < 0) {
      bVar2 = bVar35;
    }
    iVar3 = 0;
    if (!bVar2) goto LAB_001191cf;
    uVar20 = uVar12 + uVar10;
    lVar9 = lVar16 + lVar9 + (ulong)CARRY8(uVar12,uVar10);
    uVar6 = ((long)psStack_288 >> 0x3f) << 8 | (ulong)psStack_288 >> 0x38;
    uVar12 = (long)psStack_288 * 0x100;
    uVar7 = (ulong)((long)psStack_288 * -0x100 - 1U < uVar11);
    lVar8 = (0x7fffffffffffffff - uVar6) - (long)psVar21;
    psVar4 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - uVar6) - (ulong)(uVar12 != 0));
    uVar10 = (ulong)(uVar11 < (ulong)((long)psStack_288 * -0x100));
    bVar35 = (SBORROW8((long)psVar21,(long)psVar4) != SBORROW8((long)psVar21 - (long)psVar4,uVar10))
             == (long)(((long)psVar21 - (long)psVar4) - uVar10) < 0;
    psVar34 = (secp256k1_modinv64_signed62 *)(ulong)bVar35;
    bVar2 = (SBORROW8(0x7fffffffffffffff - uVar6,(long)psVar21) != SBORROW8(lVar8,uVar7)) ==
            (long)(lVar8 - uVar7) < 0;
    if ((long)psStack_288 < 0) {
      bVar2 = bVar35;
    }
    if (!bVar2) goto LAB_001191d4;
    uVar31 = (long)psVar22 << 8 | (ulong)psVar32 >> 0x38;
    uVar27 = (long)psVar32 * 0x100;
    uVar7 = (ulong)((long)psVar32 * -0x100 - 1U < uVar20);
    lVar8 = (0x7fffffffffffffff - uVar31) - lVar9;
    psVar4 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - uVar31) - (ulong)(uVar27 != 0));
    uVar10 = (ulong)(uVar20 < (ulong)((long)psVar32 * -0x100));
    psVar14 = (secp256k1_modinv64_signed62 *)((lVar9 - (long)psVar4) - uVar10);
    bVar35 = (long)psVar32 < 0;
    psVar32 = (secp256k1_modinv64_signed62 *)
              (ulong)((SBORROW8(lVar9,(long)psVar4) != SBORROW8(lVar9 - (long)psVar4,uVar10)) ==
                     (long)psVar14 < 0);
    psVar34 = (secp256k1_modinv64_signed62 *)
              (ulong)((SBORROW8(0x7fffffffffffffff - uVar31,lVar9) != SBORROW8(lVar8,uVar7)) ==
                     (long)(lVar8 - uVar7) < 0);
    if (bVar35) {
      psVar34 = psVar32;
    }
    iVar19 = 0;
    if ((char)psVar34 == '\0') goto LAB_001191d9;
    lVar8 = (long)psVar21->v + CARRY8(uVar11,uVar12) + uVar6;
    lVar9 = lVar9 + uVar31 + (ulong)CARRY8(uVar20,uVar27);
    uVar7 = lVar8 * 4 | uVar11 + uVar12 >> 0x3e;
    psVar24->v[3] = uVar11 + uVar12 & 0x3fffffffffffffff;
    a_01->v[3] = uVar20 + uVar27 & 0x3fffffffffffffff;
    psVar32 = (secp256k1_modinv64_signed62 *)(uVar7 + 0x8000000000000000);
    psVar21 = (secp256k1_modinv64_signed62 *)
              ((lVar8 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar7));
    if (psVar21 != (secp256k1_modinv64_signed62 *)0xffffffffffffffff) goto LAB_001191de;
    psVar32 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    uVar10 = uVar20 + uVar27 >> 0x3e | lVar9 * 4;
    psVar24->v[4] = uVar7;
    alen = (int)uVar10;
    if ((lVar9 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar10) != -1) goto LAB_001191e3;
    a_01->v[4] = uVar10;
    alen = 5;
    psVar32 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x1190f1;
    psVar21 = psVar24;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_001191e8;
    psVar32 = (secp256k1_modinv64_signed62 *)0x1;
    alen = 5;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x119112;
    psVar21 = psVar24;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar24,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_001191ed;
    alen = 5;
    psVar32 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x119135;
    psVar21 = a_01;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_001191f2;
    psVar32 = (secp256k1_modinv64_signed62 *)0x1;
    alen = 5;
    psStack_2e0 = (secp256k1_modinv64_signed62 *)0x119156;
    iVar3 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (iVar3 < 0) {
      return;
    }
  }
  psStack_2e0 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_17();
  psVar23 = &sStack_340;
  psStack_2f0 = psVar24;
  psStack_2e8 = psVar14;
  psStack_2e0 = psVar4;
  secp256k1_modinv64_mul_62(&sStack_318,a_01,alen,1);
  psVar24 = a;
  secp256k1_modinv64_mul_62(&sStack_340,a,5,(int64_t)psVar32);
  lVar8 = 0;
  while ((ulong)sStack_318.v[lVar8] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_340.v[lVar8]) goto LAB_0011928c;
    lVar8 = lVar8 + 1;
    if (lVar8 == 4) {
      uVar17 = 4;
      while( true ) {
        if (sStack_318.v[uVar17] < sStack_340.v[uVar17]) {
          return;
        }
        if (sStack_340.v[uVar17] < sStack_318.v[uVar17]) break;
        bVar35 = uVar17 == 0;
        uVar17 = uVar17 - 1;
        if (bVar35) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0011928c:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar8 = psVar23->v[0];
  uVar7 = psVar23->v[1];
  uVar10 = psVar23->v[2];
  uVar11 = psVar23->v[3];
  lVar9 = psVar23->v[4];
  lVar16 = 0;
  do {
    if (psVar23->v[lVar16] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_001194b6:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_001194bb;
    }
    if (0x3fffffffffffffff < psVar23->v[lVar16]) goto LAB_001194b6;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 5);
  iVar3 = secp256k1_modinv64_mul_cmp_62(psVar23,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar3 < 1) {
LAB_001194bb:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_001194c0:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_001194c5:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar23,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_001194c0;
    uVar12 = lVar9 >> 0x3f;
    uVar33 = (long)psVar24 >> 0x3f;
    uVar20 = (lVar8 + (uVar12 & 0xfffffffefffffc2f) ^ uVar33) - uVar33;
    uVar6 = ((long)uVar20 >> 0x3e) + ((uVar7 ^ uVar33) - uVar33);
    uVar27 = ((long)uVar6 >> 0x3e) + ((uVar10 ^ uVar33) - uVar33);
    uVar31 = ((long)uVar27 >> 0x3e) + ((uVar11 ^ uVar33) - uVar33);
    lVar8 = ((long)uVar31 >> 0x3e) + (((uVar12 & 0x100) + lVar9 ^ uVar33) - uVar33);
    uVar11 = lVar8 >> 0x3f;
    uVar7 = (uVar11 & 0xfffffffefffffc2f) + (uVar20 & 0x3fffffffffffffff);
    uVar10 = ((long)uVar7 >> 0x3e) + (uVar6 & 0x3fffffffffffffff);
    uVar12 = ((long)uVar10 >> 0x3e) + (uVar27 & 0x3fffffffffffffff);
    uVar20 = ((long)uVar12 >> 0x3e) + (uVar31 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar20 >> 0x3e) + (uVar11 & 0x100) + lVar8;
    psVar23->v[0] = uVar7 & 0x3fffffffffffffff;
    psVar23->v[1] = uVar10 & 0x3fffffffffffffff;
    psVar23->v[2] = uVar12 & 0x3fffffffffffffff;
    psVar23->v[3] = uVar20 & 0x3fffffffffffffff;
    psVar23->v[4] = uVar11;
    if (0x3fffffffffffffff < uVar11) goto LAB_001194c5;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar23,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar3) {
      iVar3 = secp256k1_modinv64_mul_cmp_62(psVar23,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar3 < 0) {
        return;
      }
      goto LAB_001194cf;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_001194cf:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}